

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
read_text(char *text,int32_t *outlen,int32_t maxlen,_internal_exr_seq_scratch *scratch,char *type)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int32_t namelen;
  exr_result_t rv;
  char b;
  int local_3c;
  char local_31;
  undefined8 local_30;
  long local_28;
  int local_1c;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_3c = *in_RSI; local_3c <= local_1c; local_3c = local_3c + 1) {
    iVar1 = (**(code **)(local_28 + 0x20))(local_28,&local_31,1);
    if (iVar1 != 0) {
      return iVar1;
    }
    *(char *)(local_10 + local_3c) = local_31;
    if (local_31 == '\0') break;
  }
  *local_18 = local_3c;
  if (local_1c < local_3c) {
    *(undefined1 *)(local_10 + (local_1c + -1)) = 0;
    local_4 = (**(code **)(*(long *)(local_28 + 0x30) + 0x48))
                        (*(undefined8 *)(local_28 + 0x30),0xc,
                         "Invalid %s encountered: start \'%s\' (max %d)",local_30,local_10,local_1c)
    ;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
read_text (
    char                              text[256],
    int32_t*                          outlen,
    int32_t                           maxlen,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       type)
{
    char         b;
    exr_result_t rv      = EXR_ERR_SUCCESS;
    int32_t      namelen = *outlen;

    while (namelen <= maxlen)
    {
        rv = scratch->sequential_read (scratch, &b, 1);
        if (rv != EXR_ERR_SUCCESS) return rv;
        text[namelen] = b;
        if (b == '\0') break;
        ++namelen;
    }
    *outlen = namelen;
    if (namelen > maxlen)
    {
        text[maxlen - 1] = '\0';
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Invalid %s encountered: start '%s' (max %d)",
            type,
            text,
            maxlen);
    }
    return EXR_ERR_SUCCESS;
}